

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5StructureExtendLevel(int *pRc,Fts5Structure *pStruct,int iLvl,int nExtra,int bInsert)

{
  int iVar1;
  int iVar2;
  Fts5StructureSegment *pFVar3;
  Fts5StructureSegment *pFVar4;
  
  if (*pRc != 0) {
    return;
  }
  iVar1 = pStruct->aLevel[iLvl].nSeg;
  pFVar3 = pStruct->aLevel[iLvl].aSeg;
  iVar2 = sqlite3_initialize();
  if ((iVar2 == 0) &&
     (pFVar3 = (Fts5StructureSegment *)sqlite3Realloc(pFVar3,(long)iVar1 * 0xc + 0xc),
     pFVar3 != (Fts5StructureSegment *)0x0)) {
    iVar1 = pStruct->aLevel[iLvl].nSeg;
    if (nExtra == 0) {
      pFVar4 = pFVar3 + iVar1;
    }
    else {
      memmove(pFVar3 + 1,pFVar3,(long)(iVar1 * 0xc));
      pFVar4 = pFVar3;
    }
    pFVar4->pgnoLast = 0;
    pFVar4->iSegid = 0;
    pFVar4->pgnoFirst = 0;
    pStruct->aLevel[iLvl].aSeg = pFVar3;
    return;
  }
  *pRc = 7;
  return;
}

Assistant:

static void fts5StructureExtendLevel(
  int *pRc, 
  Fts5Structure *pStruct, 
  int iLvl, 
  int nExtra, 
  int bInsert
){
  if( *pRc==SQLITE_OK ){
    Fts5StructureLevel *pLvl = &pStruct->aLevel[iLvl];
    Fts5StructureSegment *aNew;
    sqlite3_int64 nByte;

    nByte = (pLvl->nSeg + nExtra) * sizeof(Fts5StructureSegment);
    aNew = sqlite3_realloc64(pLvl->aSeg, nByte);
    if( aNew ){
      if( bInsert==0 ){
        memset(&aNew[pLvl->nSeg], 0, sizeof(Fts5StructureSegment) * nExtra);
      }else{
        int nMove = pLvl->nSeg * sizeof(Fts5StructureSegment);
        memmove(&aNew[nExtra], aNew, nMove);
        memset(aNew, 0, sizeof(Fts5StructureSegment) * nExtra);
      }
      pLvl->aSeg = aNew;
    }else{
      *pRc = SQLITE_NOMEM;
    }
  }
}